

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O3

int __thiscall ncnn::Spectrogram::load_param(Spectrogram *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  float *__s;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  float *__s_00;
  float fVar8;
  double dVar9;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->n_fft = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->power = iVar3;
  iVar3 = this->n_fft;
  iVar6 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar6 = iVar3;
  }
  iVar3 = ParamDict::get(pd,2,iVar6 >> 2);
  this->hoplen = iVar3;
  iVar3 = ParamDict::get(pd,3,this->n_fft);
  this->winlen = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->window_type = iVar3;
  iVar3 = ParamDict::get(pd,5,1);
  this->center = iVar3;
  iVar3 = ParamDict::get(pd,6,2);
  this->pad_type = iVar3;
  iVar3 = ParamDict::get(pd,7,0);
  this->normalized = iVar3;
  iVar3 = ParamDict::get(pd,8,1);
  this->onesided = iVar3;
  Mat::create(&this->window_data,(uint)(this->normalized == 2) + this->n_fft,4,(Allocator *)0x0);
  __s = (float *)(this->window_data).data;
  uVar1 = this->n_fft;
  uVar2 = this->winlen;
  uVar7 = uVar1 - uVar2;
  __s_00 = __s;
  if (1 < (int)uVar7) {
    uVar5 = (ulong)((uVar7 >> 1) - 1);
    memset(__s,0,uVar5 * 4 + 4);
    __s_00 = __s + uVar5 + 1;
  }
  iVar3 = this->window_type;
  uVar4 = uVar2;
  if (0 < (int)uVar2 && iVar3 == 0) {
    do {
      *__s_00 = 1.0;
      __s_00 = __s_00 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (iVar3 == 1 && 0 < (int)uVar2) {
    dVar9 = 0.0;
    uVar4 = uVar2;
    do {
      fVar8 = cosf((float)(dVar9 * 6.283185307179586 * (1.0 / (double)(int)uVar2)));
      *__s_00 = 0.5 - fVar8 * 0.5;
      __s_00 = __s_00 + 1;
      dVar9 = dVar9 + 1.0;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (iVar3 == 2 && 0 < (int)uVar2) {
    dVar9 = 0.0;
    uVar4 = uVar2;
    do {
      fVar8 = cosf((float)(dVar9 * 6.283185307179586 * (1.0 / (double)(int)uVar2)));
      *__s_00 = fVar8 * -0.46 + 0.54;
      __s_00 = __s_00 + 1;
      dVar9 = dVar9 + 1.0;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (0 < (int)(uVar7 - (int)uVar7 / 2)) {
    memset(__s_00,0,(ulong)((~uVar2 + uVar1) - (int)uVar7 / 2) * 4 + 4);
  }
  if (this->normalized == 2) {
    fVar8 = 0.0;
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        fVar8 = fVar8 + __s[uVar5] * __s[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    __s[(int)uVar1] = 1.0 / SQRT(fVar8);
  }
  return 0;
}

Assistant:

int Spectrogram::load_param(const ParamDict& pd)
{
    n_fft = pd.get(0, 0);
    power = pd.get(1, 0);
    hoplen = pd.get(2, n_fft / 4);
    winlen = pd.get(3, n_fft);
    window_type = pd.get(4, 0);
    center = pd.get(5, 1);
    pad_type = pd.get(6, 2);
    normalized = pd.get(7, 0);
    onesided = pd.get(8, 1);

    // assert winlen <= n_fft
    // generate window
    window_data.create(normalized == 2 ? n_fft + 1 : n_fft);
    {
        float* p = window_data;
        for (int i = 0; i < (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }
        if (window_type == 0)
        {
            // all ones
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 1.f;
            }
        }
        if (window_type == 1)
        {
            // hann window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.5f * (1 - cosf(2 * 3.14159265358979323846 * i / winlen));
            }
        }
        if (window_type == 2)
        {
            // hamming window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.54f - 0.46f * cosf(2 * 3.14159265358979323846 * i / winlen);
            }
        }
        for (int i = 0; i < n_fft - winlen - (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }

        // pre-calculated window norm factor
        if (normalized == 2)
        {
            float sqsum = 0.f;
            for (int i = 0; i < n_fft; i++)
            {
                sqsum += window_data[i] * window_data[i];
            }
            window_data[n_fft] = 1.f / sqrt(sqsum);
        }
    }

    return 0;
}